

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall just::file::impl::output_file::output_file(output_file *this,string *filename_)

{
  FILE *pFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)this,(string *)filename_);
  pFVar1 = fopen((filename_->_M_dataplus)._M_p,"wb");
  this->_f = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    std::operator+(&local_30,"Error creating file ",filename_);
    throw_errno(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

explicit output_file(const std::string& filename_) :
          _filename(filename_),
          _f(std::fopen(filename_.c_str(), "wb"))
        {
          if (!_f)
          {
            throw_errno("Error creating file " + filename_);
          }
        }